

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cmd.h
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Cmd::editLine_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Cmd *this,bool mask_mode)

{
  char cVar1;
  function<std::optional<Cmd::Hint>_(std::basic_string_view<char,_std::char_traits<char>_>)>
  *this_00;
  int iVar2;
  uint uVar3;
  ssize_t sVar4;
  Direction dir;
  string_view str;
  char ch;
  char seq [5];
  State local_a8;
  function<std::optional<Cmd::Hint>_(std::basic_string_view<char,_std::char_traits<char>_>)>
  *local_58;
  hints_type hc;
  
  local_a8.buf._M_dataplus._M_p = (pointer)&local_a8.buf.field_2;
  local_a8.buf._M_string_length = 0;
  local_a8.buf.field_2._M_local_buf[0] = '\0';
  local_a8.pos = 0;
  local_a8.oldpos = 0;
  local_a8.cols = 0;
  local_a8.maxrows._0_1_ = 0;
  local_a8.maxrows._1_7_ = 0;
  local_a8.history_index._0_1_ = 0;
  local_a8.history_index._1_7_ = 0;
  local_a8.mask_mode = false;
  iVar2 = getColumns(this);
  local_a8.cols = (size_t)iVar2;
  local_a8.maxrows._0_1_ = 0;
  local_a8.maxrows._1_7_ = 0;
  local_a8.history_index._0_1_ = 0;
  local_a8.history_index._1_7_ = 0;
  local_a8.mask_mode = mask_mode;
  std::__cxx11::string::string<std::allocator<char>>((string *)&hc,"",(allocator<char> *)seq);
  addHistoryEntry(this,(string *)&hc);
  std::__cxx11::string::~string((string *)&hc);
  str._M_str = (this->prompt)._M_dataplus._M_p;
  str._M_len = (this->prompt)._M_string_length;
  sVar4 = write_string(this,str);
  if (sVar4 == -1) {
switchD_001037db_caseD_3:
    (__return_storage_ptr__->
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = false;
LAB_00103b17:
    std::__cxx11::string::~string((string *)&local_a8);
    return __return_storage_ptr__;
  }
  local_58 = &this->hints_handler_;
switchD_001039be_caseD_45:
  sVar4 = read_char(this,&ch);
  if (sVar4 < 1) {
    std::_Optional_payload_base<std::__cxx11::string>::_Optional_payload_base<std::__cxx11::string&>
              ((_Optional_payload_base<std::__cxx11::string> *)__return_storage_ptr__,&local_a8);
    goto LAB_00103b17;
  }
  uVar3 = (uint)ch;
  if (this->complete_key_ == uVar3) {
    uVar3 = completeLine(this,&local_a8);
    if (ch < '\0') {
      std::_Optional_payload_base<std::__cxx11::string>::
      _Optional_payload_base<std::__cxx11::string&>
                ((_Optional_payload_base<std::__cxx11::string> *)__return_storage_ptr__,&local_a8);
      goto LAB_00103b17;
    }
    if (ch == '\0') goto switchD_001039be_caseD_45;
    ch = (char)uVar3;
  }
  dir = Prev;
  switch(uVar3 & 0xff) {
  case 1:
    goto switchD_001037db_caseD_1;
  case 2:
switchD_001037db_caseD_2:
    editMoveLeft(this,&local_a8);
    goto switchD_001039be_caseD_45;
  case 3:
    goto switchD_001037db_caseD_3;
  case 4:
    if (local_a8.buf._M_string_length == 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_back(&this->history_);
      goto switchD_001037db_caseD_3;
    }
LAB_001038f2:
    editDelete(this,&local_a8);
    goto switchD_001039be_caseD_45;
  case 5:
switchD_001037db_caseD_5:
    editMoveEnd(this,&local_a8);
    goto switchD_001039be_caseD_45;
  case 6:
switchD_001037db_caseD_6:
    editMoveRight(this,&local_a8);
    goto switchD_001039be_caseD_45;
  case 7:
  case 9:
  case 0xf:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x16:
  case 0x18:
  case 0x19:
    goto switchD_001037db_caseD_7;
  case 8:
switchD_001037db_caseD_8:
    editBackspace(this,&local_a8);
    goto switchD_001039be_caseD_45;
  case 10:
  case 0xd:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_back(&this->history_);
    if (this->multiline_mode == true) {
      editMoveEnd(this,&local_a8);
    }
    this_00 = local_58;
    if ((this->hints_handler_).super__Function_base._M_manager != (_Manager_type)0x0) {
      std::
      function<std::optional<Cmd::Hint>_(std::basic_string_view<char,_std::char_traits<char>_>)>::
      function(&hc,local_58);
      std::
      function<std::optional<Cmd::Hint>_(std::basic_string_view<char,_std::char_traits<char>_>)>::
      operator=(this_00,(nullptr_t)0x0);
      refreshLine(this,&local_a8);
      std::
      function<std::optional<Cmd::Hint>_(std::basic_string_view<char,_std::char_traits<char>_>)>::
      operator=(this_00,&hc);
      std::_Function_base::~_Function_base(&hc.super__Function_base);
    }
    std::_Optional_payload_base<std::__cxx11::string>::_Optional_payload_base<std::__cxx11::string&>
              ((_Optional_payload_base<std::__cxx11::string> *)__return_storage_ptr__,&local_a8);
    goto LAB_00103b17;
  case 0xb:
    std::__cxx11::string::erase((ulong)&local_a8,local_a8.pos);
    break;
  case 0xc:
    clearScreen(this);
    break;
  case 0xe:
switchD_001037db_caseD_e:
    dir = Next;
  case 0x10:
switchD_001037db_caseD_10:
    editHistoryNext(this,&local_a8,dir);
    goto switchD_001039be_caseD_45;
  case 0x14:
    if ((local_a8.pos == 0) || (local_a8.buf._M_string_length <= local_a8.pos))
    goto switchD_001039be_caseD_45;
    cVar1 = local_a8.buf._M_dataplus._M_p[local_a8.pos];
    local_a8.buf._M_dataplus._M_p[local_a8.pos] = local_a8.buf._M_dataplus._M_p[local_a8.pos - 1];
    local_a8.buf._M_dataplus._M_p[local_a8.pos - 1] = cVar1;
    if (local_a8.pos != local_a8.buf._M_string_length - 1) {
      local_a8.pos = local_a8.pos + 1;
    }
    break;
  case 0x15:
    local_a8.buf._M_string_length = 0;
    *local_a8.buf._M_dataplus._M_p = '\0';
    local_a8.pos = 0;
    break;
  case 0x17:
    editDeletePreviousWord(this,&local_a8);
    goto switchD_001039be_caseD_45;
  case 0x1a:
    disableRawMode(this,this->in_fd_);
    raise(0x14);
    enableRawMode(this,this->in_fd_);
    break;
  case 0x1b:
    sVar4 = read_char(this,seq);
    if ((sVar4 != -1) && (sVar4 = read_char(this,seq + 1), sVar4 != -1)) {
      if (seq[0] == 'O') {
        if (seq[1] == 'F') goto switchD_001037db_caseD_5;
        if (seq[1] == 'H') {
switchD_001037db_caseD_1:
          editMoveHome(this,&local_a8);
        }
      }
      else if (seq[0] == '[') {
        if (9 < (int)seq[1] - 0x30U) {
          switch(seq[1]) {
          case 'A':
            goto switchD_001037db_caseD_10;
          case 'B':
            goto switchD_001037db_caseD_e;
          case 'C':
            goto switchD_001037db_caseD_6;
          case 'D':
            goto switchD_001037db_caseD_2;
          default:
            goto switchD_001039be_caseD_45;
          case 'F':
            goto switchD_001037db_caseD_5;
          case 'H':
            goto switchD_001037db_caseD_1;
          }
        }
        sVar4 = read_char(this,seq + 2);
        if (sVar4 != -1) {
          if (seq[2] == ';') {
            sVar4 = read_char(this,seq + 3);
            if ((sVar4 != -1) && (sVar4 = read_char(this,seq + 4), sVar4 != -1)) {
              if (seq[4] == 'D' && (byte)(seq[3] ^ 0x35U) == 0) {
                editMovePrevWord(this,&local_a8);
              }
              else if ((byte)(seq[3] ^ 0x35U) == 0 && seq[4] == 'C') {
                editMoveNextWord(this,&local_a8);
              }
            }
          }
          else if ((seq[2] == '~') && (seq[1] == '3')) goto LAB_001038f2;
        }
      }
    }
    goto switchD_001039be_caseD_45;
  default:
    if ((uVar3 & 0xff) == 0x7f) goto switchD_001037db_caseD_8;
switchD_001037db_caseD_7:
    iVar2 = editInsert(this,&local_a8,(char)uVar3);
    if (iVar2 != 0) goto switchD_001037db_caseD_3;
    goto switchD_001039be_caseD_45;
  }
  refreshLine(this,&local_a8);
  goto switchD_001039be_caseD_45;
}

Assistant:

std::optional<std::string> editLine(bool mask_mode) {
		State state;

		// Populate the state that we pass to functions implementing specific editing functionalities.
		state.oldpos        = 0;
		state.pos           = 0;
		state.cols          = getColumns();
		state.maxrows       = 0;
		state.history_index = 0;
		state.mask_mode     = mask_mode;

		// The latest history entry is always our current buffer, that initially is just an empty string.
		addHistoryEntry("");

		if (write_string(prompt) == -1) {
			return {};
		}

		while (true) {

			char ch;
			if (read_char(&ch) <= 0) {
				return state.buf;
			}

			// Only autocomplete when the callback is set.
			if (ch == complete_key_) {
				int r = completeLine(&state);
				// Return on errors
				if (ch < 0)
					return state.buf;

				// Read next character when 0
				if (ch == '\0')
					continue;

				ch = r;
			}

			char seq[5];
			switch (ch) {
			case LINE_FEED:
			case ENTER: // enter
				history_.pop_back();

				if (multiline_mode) {
					editMoveEnd(&state);
				}

				if (hints_handler_) {
					// Force a refresh without hints to leave the previous line as the user typed it after a newline.
					hints_type hc  = hints_handler_;
					hints_handler_ = nullptr;
					refreshLine(&state);
					hints_handler_ = hc;
				}
				return state.buf;
			case CTRL_C: // ctrl-c
				return {};
			case CTRL_Z: // ctrl-z
#ifdef SIGTSTP
				// send ourselves SIGSUSP
				disableRawMode(in_fd_);
				raise(SIGTSTP);
				// and resume
				enableRawMode(in_fd_);
				refreshLine(&state);
#endif
				continue;
			case BACKSPACE: // backspace
			case CTRL_H:    // ctrl-h
				editBackspace(&state);
				break;
			case CTRL_D: // ctrl-d, remove char at right of cursor, or if the line is empty, act as end-of-file.
				if (!state.buf.empty()) {
					editDelete(&state);
				} else {
					history_.pop_back();
					return {};
				}
				break;
			case CTRL_T: // ctrl-t, swaps current character with previous.
				if (state.pos > 0 && state.pos < state.buf.size()) {
					std::swap(state.buf[state.pos], state.buf[state.pos - 1]);

					if (state.pos != state.buf.size() - 1) {
						state.pos++;
					}
					refreshLine(&state);
				}
				break;
			case CTRL_B: // ctrl-b
				editMoveLeft(&state);
				break;
			case CTRL_F: // ctrl-f
				editMoveRight(&state);
				break;
			case CTRL_P: // ctrl-p
				editHistoryNext(&state, Direction::Prev);
				break;
			case CTRL_N: // ctrl-n
				editHistoryNext(&state, Direction::Next);
				break;
			case ESC: // escape sequence
				// Read the next two bytes representing the escape sequence.
				// Use two calls to handle slow terminals returning the two chars at different times.
				if (read_char(&seq[0]) == -1) {
					break;
				}

				if (read_char(&seq[1]) == -1) {
					break;
				}

				// ESC [ sequences.
				if (seq[0] == '[') {
					if (isdigit(seq[1])) {

						// Extended escape, read additional byte.
						if (read_char(&seq[2]) == -1) {
							break;
						}

						switch (seq[2]) {
						case '~':
							switch (seq[1]) {
							case '3': // Delete key.
								editDelete(&state);
								break;
							}
							break;
						case ';':
							// Read the next two bytes representing the escape sequence.
							// Use two calls to handle slow terminals returning the two chars at different times.
							if (read_char(&seq[3]) == -1) {
								break;
							}

							if (read_char(&seq[4]) == -1) {
								break;
							}

							if (seq[3] == '5' && seq[4] == 'D') {
								editMovePrevWord(&state);
							} else if (seq[3] == '5' && seq[4] == 'C') {
								editMoveNextWord(&state);
							}
							break;
						}
					} else {
						switch (seq[1]) {
						case 'A': // Up
							editHistoryNext(&state, Direction::Prev);
							break;
						case 'B': // Down
							editHistoryNext(&state, Direction::Next);
							break;
						case 'C': // Right
							editMoveRight(&state);
							break;
						case 'D': // Left
							editMoveLeft(&state);
							break;
						case 'H': // Home
							editMoveHome(&state);
							break;
						case 'F': // End
							editMoveEnd(&state);
							break;
						}
					}
				}

				// ESC O sequences.
				else if (seq[0] == 'O') {
					switch (seq[1]) {
					case 'H': // Home
						editMoveHome(&state);
						break;
					case 'F': // End
						editMoveEnd(&state);
						break;
					}
				}
				break;
			default:
				if (editInsert(&state, ch)) {
					return {};
				}
				break;
			case CTRL_U: // Ctrl+u, delete the whole line.
				state.buf.clear();
				state.pos = 0;
				refreshLine(&state);
				break;
			case CTRL_K: // Ctrl+k, delete from current to end of line.
				state.buf.erase(state.pos);
				refreshLine(&state);
				break;
			case CTRL_A: // Ctrl+a, go to the start of the line
				editMoveHome(&state);
				break;
			case CTRL_E: // ctrl+e, go to the end of the line
				editMoveEnd(&state);
				break;
			case CTRL_L: // ctrl+l, clear screen
				clearScreen();
				refreshLine(&state);
				break;
			case CTRL_W: // ctrl+w, delete previous word
				editDeletePreviousWord(&state);
				break;
			}
		}
		return state.buf;
	}